

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSetFull::ToEquivClass<unsigned_int>
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint base,uint *tblidx,
          CharSet<unsigned_int> *result,codepoint_t baseOffset)

{
  uint hc;
  uint lc;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint h;
  int iVar4;
  long lVar5;
  uint l;
  codepoint_t local_68 [2];
  uint equivl [4];
  uint local_34 [2];
  uint acth;
  
  l = baseOffset + 0xff + base;
  if (level != 2) {
    l = baseOffset + base;
  }
  h = ~(-1 << ((char)level * '\x04' + 8U & 0x1f)) + baseOffset + base;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    CaseInsensitive::RangeToEquivClass(tblidx,l,h,local_34,local_68);
    iVar4 = local_34[0] - l;
    lVar5 = 0;
    do {
      lc = local_68[lVar5];
      if (0x10ffff < lc) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0xb6,"(c <= MaxChar)","c <= MaxChar");
        if (!bVar2) goto LAB_00e724cf;
        *puVar3 = 0;
      }
      hc = lc + iVar4;
      if (0x10ffff < hc) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0xbd,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar2) {
LAB_00e724cf:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      CharSet<unsigned_int>::SetRange(result,allocator,lc,hc);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    l = local_34[0] + 1;
    if (h < l) {
      return;
    }
  } while( true );
}

Assistant:

void CharSetFull::ToEquivClass(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        uint l = base + (CharSetNode::levels - 1 == level ? 0xff : 0) + baseOffset;
        uint h = base + lim(level) + baseOffset;

        do
        {
            uint acth;
            C equivl[CaseInsensitive::EquivClassSize];
            CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
            uint n = acth - l;
            for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
            {
                result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
            }

            // Go around again for rest of this range
            l = acth + 1;
        }
        while (l <= h);
    }